

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O3

void * deMemPool_alignedAlloc(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  deMemPoolUtil *pdVar1;
  int iVar2;
  MemPage *pMVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  pMVar3 = pool->currentPage;
  iVar8 = pMVar3->bytesAllocated;
  uVar7 = (ulong)alignBytes;
  pvVar4 = (void *)((long)&pMVar3->nextPage + uVar7 + (long)iVar8 + 7 & -uVar7);
  uVar6 = (long)pvVar4 + (numBytes - ((long)&pMVar3[1].capacity + (long)iVar8));
  if ((ulong)(long)(pMVar3->capacity - iVar8) < uVar6) {
    iVar8 = 0;
    iVar2 = alignBytes - 4;
    if ((int)(alignBytes - 4) < 1) {
      iVar2 = 0;
    }
    iVar5 = pMVar3->capacity * 2;
    if (0x1f9f < iVar5) {
      iVar5 = 0x1fa0;
    }
    iVar2 = (int)numBytes + iVar2;
    if (iVar5 <= iVar2) {
      iVar5 = iVar2;
    }
    pMVar3 = (MemPage *)deMalloc((long)iVar5 + 0x10);
    if (pMVar3 == (MemPage *)0x0) goto LAB_001107b4;
    pMVar3->capacity = 0;
    pMVar3->bytesAllocated = 0;
    pMVar3->nextPage = (MemPage *)0x0;
    pMVar3->capacity = iVar5;
    pMVar3->nextPage = pool->currentPage;
    pool->currentPage = pMVar3;
    pvVar4 = (void *)((long)&pMVar3->nextPage + uVar7 + 7 & -uVar7);
    uVar6 = (numBytes - (long)(pMVar3 + 1)) + (long)pvVar4;
  }
  pMVar3->bytesAllocated = (int)uVar6 + iVar8;
  if (pvVar4 != (void *)0x0) {
    return pvVar4;
  }
LAB_001107b4:
  pdVar1 = pool->util;
  if (pdVar1 != (deMemPoolUtil *)0x0) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return (void *)0x0;
}

Assistant:

void* deMemPool_alignedAlloc (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	ptr = deMemPool_allocInternal(pool, numBytes, alignBytes);
	DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}